

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sisd_alignment_engine.cpp
# Opt level: O0

Alignment * __thiscall
spoa::SisdAlignmentEngine::Linear
          (Alignment *__return_storage_ptr__,SisdAlignmentEngine *this,uint32_t sequence_len,
          Graph *graph,int32_t *score)

{
  int iVar1;
  bool bVar2;
  vector<spoa::Graph::Node_*,_std::allocator<spoa::Graph::Node_*>_> *this_00;
  int *piVar3;
  ulong uVar4;
  pointer pIVar5;
  uint32_t *puVar6;
  reference ppEVar7;
  reference pvVar8;
  size_type sVar9;
  const_reference ppNVar10;
  iterator __first;
  iterator __last;
  uint local_26c;
  uint32_t local_268;
  uint32_t local_234;
  uint32_t local_204;
  bool local_1fc;
  bool local_1fa;
  uint local_1b4;
  uint local_17c;
  uint32_t local_178;
  uint local_174;
  uint local_170;
  uint32_t pred_i_4;
  uint32_t p_2;
  uint32_t pred_i_3;
  value_type *it_2;
  uint32_t pred_i_2;
  uint32_t p_1;
  uint32_t pred_i_1;
  int32_t match_cost;
  value_type *it_1;
  uint uStack_140;
  bool predecessor_found;
  int32_t H_ij;
  uint32_t prev_j;
  uint32_t prev_i;
  anon_class_16_2_94731f0a ov_condition;
  anon_class_16_2_94731f0a nw_condition;
  anon_class_32_4_301e362c sw_condition;
  undefined1 local_f0 [4];
  uint32_t j;
  uint32_t i;
  AlignmentSubtype local_e4;
  vector<spoa::Graph::Node_*,_std::allocator<spoa::Graph::Node_*>_> *local_e0;
  uint64_t j_3;
  vector<spoa::Graph::Node_*,_std::allocator<spoa::Graph::Node_*>_> *local_d0;
  uint64_t j_2;
  int local_c0;
  uint32_t p;
  vector<spoa::Graph::Node_*,_std::allocator<spoa::Graph::Node_*>_> *local_b8;
  uint64_t j_1;
  int32_t *H_pred_row;
  int32_t *H_row;
  uint32_t pred_i;
  uint32_t i_1;
  uint32_t *local_90;
  value_type **char_profile;
  Node **it;
  const_iterator __end1;
  const_iterator __begin1;
  vector<spoa::Graph::Node_*,_std::allocator<spoa::Graph::Node_*>_> *__range1;
  anon_class_24_3_35fc668f update_max_score;
  uint local_48;
  uint32_t max_j;
  uint32_t max_i;
  int32_t max_score;
  vector<spoa::Graph::Node_*,_std::allocator<spoa::Graph::Node_*>_> *rank_to_node;
  uint64_t matrix_width;
  int32_t *score_local;
  Graph *graph_local;
  SisdAlignmentEngine *pSStack_18;
  uint32_t sequence_len_local;
  SisdAlignmentEngine *this_local;
  Alignment *alignment;
  
  rank_to_node = (vector<spoa::Graph::Node_*,_std::allocator<spoa::Graph::Node_*>_> *)
                 (ulong)(sequence_len + 1);
  matrix_width = (uint64_t)score;
  score_local = (int32_t *)graph;
  graph_local._4_4_ = sequence_len;
  pSStack_18 = this;
  this_local = (SisdAlignmentEngine *)__return_storage_ptr__;
  this_00 = Graph::rank_to_node(graph);
  max_j = 0x80000400;
  if ((this->super_AlignmentEngine).type_ == kSW) {
    max_j = 0;
  }
  local_48 = 0;
  update_max_score.max_j._4_4_ = 0;
  __range1 = (vector<spoa::Graph::Node_*,_std::allocator<spoa::Graph::Node_*>_> *)&max_j;
  update_max_score.max_score = (int32_t *)&local_48;
  update_max_score.max_i = (uint32_t *)((long)&update_max_score.max_j + 4);
  _max_i = this_00;
  __end1 = std::vector<spoa::Graph::Node_*,_std::allocator<spoa::Graph::Node_*>_>::begin(this_00);
  it = (Node **)std::vector<spoa::Graph::Node_*,_std::allocator<spoa::Graph::Node_*>_>::end(this_00)
  ;
  while (bVar2 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<spoa::Graph::Node_*const_*,_std::vector<spoa::Graph::Node_*,_std::allocator<spoa::Graph::Node_*>_>_>
                                     *)&it), bVar2) {
    char_profile = (value_type **)
                   __gnu_cxx::
                   __normal_iterator<spoa::Graph::Node_*const_*,_std::vector<spoa::Graph::Node_*,_std::allocator<spoa::Graph::Node_*>_>_>
                   ::operator*(&__end1);
    pIVar5 = std::
             unique_ptr<spoa::SisdAlignmentEngine::Implementation,_std::default_delete<spoa::SisdAlignmentEngine::Implementation>_>
             ::operator->(&this->pimpl_);
    _pred_i = std::vector<int,_std::allocator<int>_>::operator[]
                        (&pIVar5->sequence_profile,
                         (ulong)(uint)(*char_profile)[1] * (long)rank_to_node);
    local_90 = &pred_i;
    pIVar5 = std::
             unique_ptr<spoa::SisdAlignmentEngine::Implementation,_std::default_delete<spoa::SisdAlignmentEngine::Implementation>_>
             ::operator->(&this->pimpl_);
    pvVar8 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                       (&pIVar5->node_id_to_rank,(ulong)(uint)**char_profile);
    H_row._4_4_ = *pvVar8 + 1;
    bVar2 = std::vector<spoa::Graph::Edge_*,_std::allocator<spoa::Graph::Edge_*>_>::empty
                      ((vector<spoa::Graph::Edge_*,_std::allocator<spoa::Graph::Edge_*>_> *)
                       (*char_profile + 2));
    if (bVar2) {
      local_1b4 = 0;
    }
    else {
      pIVar5 = std::
               unique_ptr<spoa::SisdAlignmentEngine::Implementation,_std::default_delete<spoa::SisdAlignmentEngine::Implementation>_>
               ::operator->(&this->pimpl_);
      ppEVar7 = std::vector<spoa::Graph::Edge_*,_std::allocator<spoa::Graph::Edge_*>_>::operator[]
                          ((vector<spoa::Graph::Edge_*,_std::allocator<spoa::Graph::Edge_*>_> *)
                           (*char_profile + 2),0);
      pvVar8 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                         (&pIVar5->node_id_to_rank,(ulong)(*ppEVar7)->tail->id);
      local_1b4 = *pvVar8 + 1;
    }
    H_row._0_4_ = local_1b4;
    pIVar5 = std::
             unique_ptr<spoa::SisdAlignmentEngine::Implementation,_std::default_delete<spoa::SisdAlignmentEngine::Implementation>_>
             ::operator->(&this->pimpl_);
    H_pred_row = pIVar5->H + (ulong)H_row._4_4_ * (long)rank_to_node;
    pIVar5 = std::
             unique_ptr<spoa::SisdAlignmentEngine::Implementation,_std::default_delete<spoa::SisdAlignmentEngine::Implementation>_>
             ::operator->(&this->pimpl_);
    j_1 = (uint64_t)(pIVar5->H + (ulong)(uint)H_row * (long)rank_to_node);
    for (local_b8 = (vector<spoa::Graph::Node_*,_std::allocator<spoa::Graph::Node_*>_> *)0x1;
        local_b8 < rank_to_node;
        local_b8 = (vector<spoa::Graph::Node_*,_std::allocator<spoa::Graph::Node_*>_> *)
                   ((long)&(local_b8->
                           super__Vector_base<spoa::Graph::Node_*,_std::allocator<spoa::Graph::Node_*>_>
                           )._M_impl.super__Vector_impl_data._M_start + 1)) {
      p = *(int *)((j_1 - 4) + (long)local_b8 * 4) +
          *(int *)(*(long *)local_90 + (long)local_b8 * 4);
      local_c0 = *(int *)(j_1 + (long)local_b8 * 4) + (int)(this->super_AlignmentEngine).g_;
      piVar3 = std::max<int>((int *)&p,&local_c0);
      H_pred_row[(long)local_b8] = *piVar3;
    }
    for (j_2._4_4_ = 1; uVar4 = (ulong)j_2._4_4_,
        sVar9 = std::vector<spoa::Graph::Edge_*,_std::allocator<spoa::Graph::Edge_*>_>::size
                          ((vector<spoa::Graph::Edge_*,_std::allocator<spoa::Graph::Edge_*>_> *)
                           (*char_profile + 2)), uVar4 < sVar9; j_2._4_4_ = j_2._4_4_ + 1) {
      pIVar5 = std::
               unique_ptr<spoa::SisdAlignmentEngine::Implementation,_std::default_delete<spoa::SisdAlignmentEngine::Implementation>_>
               ::operator->(&this->pimpl_);
      ppEVar7 = std::vector<spoa::Graph::Edge_*,_std::allocator<spoa::Graph::Edge_*>_>::operator[]
                          ((vector<spoa::Graph::Edge_*,_std::allocator<spoa::Graph::Edge_*>_> *)
                           (*char_profile + 2),(ulong)j_2._4_4_);
      pvVar8 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                         (&pIVar5->node_id_to_rank,(ulong)(*ppEVar7)->tail->id);
      H_row._0_4_ = *pvVar8 + 1;
      pIVar5 = std::
               unique_ptr<spoa::SisdAlignmentEngine::Implementation,_std::default_delete<spoa::SisdAlignmentEngine::Implementation>_>
               ::operator->(&this->pimpl_);
      j_1 = (uint64_t)(pIVar5->H + (ulong)(uint)H_row * (long)rank_to_node);
      for (local_d0 = (vector<spoa::Graph::Node_*,_std::allocator<spoa::Graph::Node_*>_> *)0x1;
          local_d0 < rank_to_node;
          local_d0 = (vector<spoa::Graph::Node_*,_std::allocator<spoa::Graph::Node_*>_> *)
                     ((long)&(local_d0->
                             super__Vector_base<spoa::Graph::Node_*,_std::allocator<spoa::Graph::Node_*>_>
                             )._M_impl.super__Vector_impl_data._M_start + 1)) {
        j_3._4_4_ = *(int *)((j_1 - 4) + (long)local_d0 * 4) +
                    *(int *)(*(long *)local_90 + (long)local_d0 * 4);
        j_3._0_4_ = *(int *)(j_1 + (long)local_d0 * 4) + (int)(this->super_AlignmentEngine).g_;
        piVar3 = std::max<int>(H_pred_row + (long)local_d0,(int *)&j_3);
        piVar3 = std::max<int>((int *)((long)&j_3 + 4),piVar3);
        H_pred_row[(long)local_d0] = *piVar3;
      }
    }
    for (local_e0 = (vector<spoa::Graph::Node_*,_std::allocator<spoa::Graph::Node_*>_> *)0x1;
        local_e0 < rank_to_node;
        local_e0 = (vector<spoa::Graph::Node_*,_std::allocator<spoa::Graph::Node_*>_> *)
                   ((long)&(local_e0->
                           super__Vector_base<spoa::Graph::Node_*,_std::allocator<spoa::Graph::Node_*>_>
                           )._M_impl.super__Vector_impl_data._M_start + 1)) {
      local_e4 = H_pred_row
                 [(long)((long)&local_e0[-1].
                                super__Vector_base<spoa::Graph::Node_*,_std::allocator<spoa::Graph::Node_*>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage + 7)] +
                 (int)(this->super_AlignmentEngine).g_;
      piVar3 = std::max<int>((int *)&local_e4,H_pred_row + (long)local_e0);
      H_pred_row[(long)local_e0] = *piVar3;
      if ((this->super_AlignmentEngine).type_ == kSW) {
        i = 0;
        piVar3 = std::max<int>(H_pred_row + (long)local_e0,(int *)&i);
        H_pred_row[(long)local_e0] = *piVar3;
        Linear::anon_class_24_3_35fc668f::operator()
                  ((anon_class_24_3_35fc668f *)&__range1,H_pred_row,H_row._4_4_,(uint32_t)local_e0);
      }
      else if ((((this->super_AlignmentEngine).type_ == kNW) &&
               (bVar2 = std::vector<spoa::Graph::Edge_*,_std::allocator<spoa::Graph::Edge_*>_>::
                        empty((vector<spoa::Graph::Edge_*,_std::allocator<spoa::Graph::Edge_*>_> *)
                              (*char_profile + 8)), bVar2)) &&
              (local_e0 ==
               (vector<spoa::Graph::Node_*,_std::allocator<spoa::Graph::Node_*>_> *)
               ((long)&rank_to_node[-1].
                       super__Vector_base<spoa::Graph::Node_*,_std::allocator<spoa::Graph::Node_*>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage + 7U))) {
        Linear::anon_class_24_3_35fc668f::operator()
                  ((anon_class_24_3_35fc668f *)&__range1,H_pred_row,H_row._4_4_,(uint32_t)local_e0);
      }
      else if (((this->super_AlignmentEngine).type_ == kOV) &&
              (bVar2 = std::vector<spoa::Graph::Edge_*,_std::allocator<spoa::Graph::Edge_*>_>::empty
                                 ((vector<spoa::Graph::Edge_*,_std::allocator<spoa::Graph::Edge_*>_>
                                   *)(*char_profile + 8)), bVar2)) {
        Linear::anon_class_24_3_35fc668f::operator()
                  ((anon_class_24_3_35fc668f *)&__range1,H_pred_row,H_row._4_4_,(uint32_t)local_e0);
      }
    }
    __gnu_cxx::
    __normal_iterator<spoa::Graph::Node_*const_*,_std::vector<spoa::Graph::Node_*,_std::allocator<spoa::Graph::Node_*>_>_>
    ::operator++(&__end1);
  }
  if ((local_48 == 0) && (update_max_score.max_j._4_4_ == 0)) {
    memset(__return_storage_ptr__,0,0x18);
    std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::vector
              (__return_storage_ptr__);
    return __return_storage_ptr__;
  }
  if (matrix_width != 0) {
    *(uint32_t *)matrix_width = max_j;
  }
  j._3_1_ = 0;
  std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::vector
            (__return_storage_ptr__);
  local_f0 = (undefined1  [4])local_48;
  sw_condition.matrix_width._4_4_ = update_max_score.max_j._4_4_;
  sw_condition.this = (SisdAlignmentEngine *)local_f0;
  sw_condition.i = (uint32_t *)((long)&sw_condition.matrix_width + 4);
  sw_condition.j = (uint32_t *)&rank_to_node;
  ov_condition.j = (uint32_t *)local_f0;
  nw_condition.i = (uint32_t *)((long)&sw_condition.matrix_width + 4);
  _prev_j = (uint32_t *)local_f0;
  ov_condition.i = (uint32_t *)((long)&sw_condition.matrix_width + 4);
  H_ij = 0;
  uStack_140 = 0;
  nw_condition.j = (uint32_t *)this;
  do {
    if ((this->super_AlignmentEngine).type_ == kSW) {
      bVar2 = Linear::anon_class_32_4_301e362c::operator()
                        ((anon_class_32_4_301e362c *)&nw_condition.j);
      local_1fa = true;
      if (!bVar2) goto LAB_0014e0cc;
    }
    else {
LAB_0014e0cc:
      if ((this->super_AlignmentEngine).type_ == kNW) {
        bVar2 = Linear::anon_class_16_2_94731f0a::operator()
                          ((anon_class_16_2_94731f0a *)&ov_condition.j);
        local_1fa = true;
        if (bVar2) goto LAB_0014e145;
      }
      local_1fc = false;
      if ((this->super_AlignmentEngine).type_ == kOV) {
        local_1fc = Linear::anon_class_16_2_94731f0a::operator()
                              ((anon_class_16_2_94731f0a *)&prev_j);
      }
      local_1fa = local_1fc;
    }
LAB_0014e145:
    if (local_1fa == false) {
      __first = std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::begin
                          (__return_storage_ptr__);
      __last = std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::end
                         (__return_storage_ptr__);
      std::
      reverse<__gnu_cxx::__normal_iterator<std::pair<int,int>*,std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>>>
                ((__normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
                  )__first._M_current,
                 (__normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
                  )__last._M_current);
      return __return_storage_ptr__;
    }
    pIVar5 = std::
             unique_ptr<spoa::SisdAlignmentEngine::Implementation,_std::default_delete<spoa::SisdAlignmentEngine::Implementation>_>
             ::operator->(&this->pimpl_);
    it_1._4_4_ = pIVar5->H[(ulong)(uint)local_f0 * (long)rank_to_node +
                           (ulong)sw_condition.matrix_width._4_4_];
    it_1._3_1_ = 0;
    if ((local_f0 != (undefined1  [4])0x0) && (sw_condition.matrix_width._4_4_ != 0)) {
      _pred_i_1 = std::vector<spoa::Graph::Node_*,_std::allocator<spoa::Graph::Node_*>_>::operator[]
                            (_max_i,(ulong)((int)local_f0 - 1));
      pIVar5 = std::
               unique_ptr<spoa::SisdAlignmentEngine::Implementation,_std::default_delete<spoa::SisdAlignmentEngine::Implementation>_>
               ::operator->(&this->pimpl_);
      puVar6 = (uint32_t *)
               std::vector<int,_std::allocator<int>_>::operator[]
                         (&pIVar5->sequence_profile,
                          (ulong)(*_pred_i_1)->code * (long)rank_to_node +
                          (ulong)sw_condition.matrix_width._4_4_);
      p_1 = *puVar6;
      bVar2 = std::vector<spoa::Graph::Edge_*,_std::allocator<spoa::Graph::Edge_*>_>::empty
                        (&(*_pred_i_1)->inedges);
      if (bVar2) {
        local_204 = 0;
      }
      else {
        pIVar5 = std::
                 unique_ptr<spoa::SisdAlignmentEngine::Implementation,_std::default_delete<spoa::SisdAlignmentEngine::Implementation>_>
                 ::operator->(&this->pimpl_);
        ppEVar7 = std::vector<spoa::Graph::Edge_*,_std::allocator<spoa::Graph::Edge_*>_>::operator[]
                            (&(*_pred_i_1)->inedges,0);
        pvVar8 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                           (&pIVar5->node_id_to_rank,(ulong)(*ppEVar7)->tail->id);
        local_204 = *pvVar8 + 1;
      }
      iVar1 = it_1._4_4_;
      pred_i_2 = local_204;
      pIVar5 = std::
               unique_ptr<spoa::SisdAlignmentEngine::Implementation,_std::default_delete<spoa::SisdAlignmentEngine::Implementation>_>
               ::operator->(&this->pimpl_);
      if (iVar1 == pIVar5->H[(ulong)pred_i_2 * (long)rank_to_node +
                             (ulong)(sw_condition.matrix_width._4_4_ - 1)] + p_1) {
        H_ij = pred_i_2;
        uStack_140 = sw_condition.matrix_width._4_4_ - 1;
        it_1._3_1_ = 1;
      }
      else {
        for (it_2._4_4_ = 1; uVar4 = (ulong)it_2._4_4_,
            sVar9 = std::vector<spoa::Graph::Edge_*,_std::allocator<spoa::Graph::Edge_*>_>::size
                              (&(*_pred_i_1)->inedges), uVar4 < sVar9; it_2._4_4_ = it_2._4_4_ + 1)
        {
          pIVar5 = std::
                   unique_ptr<spoa::SisdAlignmentEngine::Implementation,_std::default_delete<spoa::SisdAlignmentEngine::Implementation>_>
                   ::operator->(&this->pimpl_);
          ppEVar7 = std::vector<spoa::Graph::Edge_*,_std::allocator<spoa::Graph::Edge_*>_>::
                    operator[](&(*_pred_i_1)->inedges,(ulong)it_2._4_4_);
          pvVar8 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                             (&pIVar5->node_id_to_rank,(ulong)(*ppEVar7)->tail->id);
          iVar1 = it_1._4_4_;
          it_2._0_4_ = *pvVar8 + 1;
          pIVar5 = std::
                   unique_ptr<spoa::SisdAlignmentEngine::Implementation,_std::default_delete<spoa::SisdAlignmentEngine::Implementation>_>
                   ::operator->(&this->pimpl_);
          if (iVar1 == pIVar5->H[(ulong)(uint)it_2 * (long)rank_to_node +
                                 (ulong)(sw_condition.matrix_width._4_4_ - 1)] + p_1) {
            H_ij = (uint)it_2;
            uStack_140 = sw_condition.matrix_width._4_4_ - 1;
            it_1._3_1_ = 1;
            break;
          }
        }
      }
    }
    if (((it_1._3_1_ & 1) == 0) && (local_f0 != (undefined1  [4])0x0)) {
      _p_2 = std::vector<spoa::Graph::Node_*,_std::allocator<spoa::Graph::Node_*>_>::operator[]
                       (_max_i,(ulong)((int)local_f0 - 1));
      bVar2 = std::vector<spoa::Graph::Edge_*,_std::allocator<spoa::Graph::Edge_*>_>::empty
                        (&(*_p_2)->inedges);
      if (bVar2) {
        local_234 = 0;
      }
      else {
        pIVar5 = std::
                 unique_ptr<spoa::SisdAlignmentEngine::Implementation,_std::default_delete<spoa::SisdAlignmentEngine::Implementation>_>
                 ::operator->(&this->pimpl_);
        ppEVar7 = std::vector<spoa::Graph::Edge_*,_std::allocator<spoa::Graph::Edge_*>_>::operator[]
                            (&(*_p_2)->inedges,0);
        pvVar8 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                           (&pIVar5->node_id_to_rank,(ulong)(*ppEVar7)->tail->id);
        local_234 = *pvVar8 + 1;
      }
      iVar1 = it_1._4_4_;
      pred_i_4 = local_234;
      pIVar5 = std::
               unique_ptr<spoa::SisdAlignmentEngine::Implementation,_std::default_delete<spoa::SisdAlignmentEngine::Implementation>_>
               ::operator->(&this->pimpl_);
      if (iVar1 == pIVar5->H[(ulong)pred_i_4 * (long)rank_to_node +
                             (ulong)sw_condition.matrix_width._4_4_] +
                   (int)(this->super_AlignmentEngine).g_) {
        H_ij = pred_i_4;
        uStack_140 = sw_condition.matrix_width._4_4_;
        it_1._3_1_ = 1;
      }
      else {
        for (local_170 = 1; uVar4 = (ulong)local_170,
            sVar9 = std::vector<spoa::Graph::Edge_*,_std::allocator<spoa::Graph::Edge_*>_>::size
                              (&(*_p_2)->inedges), uVar4 < sVar9; local_170 = local_170 + 1) {
          pIVar5 = std::
                   unique_ptr<spoa::SisdAlignmentEngine::Implementation,_std::default_delete<spoa::SisdAlignmentEngine::Implementation>_>
                   ::operator->(&this->pimpl_);
          ppEVar7 = std::vector<spoa::Graph::Edge_*,_std::allocator<spoa::Graph::Edge_*>_>::
                    operator[](&(*_p_2)->inedges,(ulong)local_170);
          pvVar8 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                             (&pIVar5->node_id_to_rank,(ulong)(*ppEVar7)->tail->id);
          iVar1 = it_1._4_4_;
          local_174 = *pvVar8 + 1;
          pIVar5 = std::
                   unique_ptr<spoa::SisdAlignmentEngine::Implementation,_std::default_delete<spoa::SisdAlignmentEngine::Implementation>_>
                   ::operator->(&this->pimpl_);
          if (iVar1 == pIVar5->H[(ulong)local_174 * (long)rank_to_node +
                                 (ulong)sw_condition.matrix_width._4_4_] +
                       (int)(this->super_AlignmentEngine).g_) {
            H_ij = local_174;
            uStack_140 = sw_condition.matrix_width._4_4_;
            it_1._3_1_ = 1;
            break;
          }
        }
      }
    }
    iVar1 = it_1._4_4_;
    if (((it_1._3_1_ & 1) == 0) &&
       (pIVar5 = std::
                 unique_ptr<spoa::SisdAlignmentEngine::Implementation,_std::default_delete<spoa::SisdAlignmentEngine::Implementation>_>
                 ::operator->(&this->pimpl_),
       iVar1 == pIVar5->H[(ulong)(uint)local_f0 * (long)rank_to_node +
                          (ulong)sw_condition.matrix_width._4_4_ + -1] +
                (int)(this->super_AlignmentEngine).g_)) {
      H_ij = (int32_t)local_f0;
      uStack_140 = sw_condition.matrix_width._4_4_ - 1;
      it_1._3_1_ = 1;
    }
    if (local_f0 == (undefined1  [4])H_ij) {
      local_268 = 0xffffffff;
    }
    else {
      ppNVar10 = std::vector<spoa::Graph::Node_*,_std::allocator<spoa::Graph::Node_*>_>::operator[]
                           (_max_i,(ulong)((int)local_f0 - 1));
      local_268 = (*ppNVar10)->id;
    }
    local_178 = local_268;
    if (sw_condition.matrix_width._4_4_ == uStack_140) {
      local_26c = 0xffffffff;
    }
    else {
      local_26c = sw_condition.matrix_width._4_4_ - 1;
    }
    local_17c = local_26c;
    std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>::
    emplace_back<unsigned_int,unsigned_int>
              ((vector<std::pair<int,int>,std::allocator<std::pair<int,int>>> *)
               __return_storage_ptr__,&local_178,&local_17c);
    local_f0 = (undefined1  [4])H_ij;
    sw_condition.matrix_width._4_4_ = uStack_140;
  } while( true );
}

Assistant:

Alignment SisdAlignmentEngine::Linear(
    std::uint32_t sequence_len,
    const Graph& graph,
    std::int32_t* score) noexcept {
  std::uint64_t matrix_width = sequence_len + 1;
  const auto& rank_to_node = graph.rank_to_node();

  std::int32_t max_score = type_ == AlignmentType::kSW ? 0 : kNegativeInfinity;
  std::uint32_t max_i = 0;
  std::uint32_t max_j = 0;
  auto update_max_score = [&max_score, &max_i, &max_j] (
      std::int32_t* H_row,
      std::uint32_t i,
      std::uint32_t j) -> void {
    if (max_score < H_row[j]) {
      max_score = H_row[j];
      max_i = i;
      max_j = j;
    }
    return;
  };

  // alignment
  for (const auto& it : rank_to_node) {
    const auto& char_profile =
        &(pimpl_->sequence_profile[it->code * matrix_width]);

    std::uint32_t i = pimpl_->node_id_to_rank[it->id] + 1;
    std::uint32_t pred_i = it->inedges.empty() ?
        0 : pimpl_->node_id_to_rank[it->inedges[0]->tail->id] + 1;

    std::int32_t* H_row = &(pimpl_->H[i * matrix_width]);
    std::int32_t* H_pred_row = &(pimpl_->H[pred_i * matrix_width]);

    // update H
    for (std::uint64_t j = 1; j < matrix_width; ++j) {
      H_row[j] = std::max(
          H_pred_row[j - 1] + char_profile[j],
          H_pred_row[j] + g_);
    }
    // check other predeccessors
    for (std::uint32_t p = 1; p < it->inedges.size(); ++p) {
      pred_i = pimpl_->node_id_to_rank[it->inedges[p]->tail->id] + 1;

      H_pred_row = &(pimpl_->H[pred_i * matrix_width]);

      for (std::uint64_t j = 1; j < matrix_width; ++j) {
        H_row[j] = std::max(
            H_pred_row[j - 1] + char_profile[j],
            std::max(
                H_row[j],
                H_pred_row[j] + g_));
      }
    }

    for (std::uint64_t j = 1; j < matrix_width; ++j) {
      H_row[j] = std::max(H_row[j - 1] + g_, H_row[j]);

      if (type_ == AlignmentType::kSW) {
        H_row[j] = std::max(H_row[j], 0);
        update_max_score(H_row, i, j);
      } else if (type_ == AlignmentType::kNW &&
          it->outedges.empty() && j == matrix_width - 1) {
        update_max_score(H_row, i, j);
      } else if (type_ == AlignmentType::kOV && it->outedges.empty()) {
        update_max_score(H_row, i, j);
      }
    }
  }

  if (max_i == 0 && max_j == 0) {
    return Alignment();
  }
  if (score) {
    *score = max_score;
  }

  // backtrack
  Alignment alignment;
  std::uint32_t i = max_i;
  std::uint32_t j = max_j;

  auto sw_condition = [this, &i, &j, &matrix_width] () -> bool {
    return (pimpl_->H[i * matrix_width + j] == 0) ? false : true;
  };
  auto nw_condition = [&i, &j] () -> bool {
    return (i == 0 && j == 0) ? false : true;
  };
  auto ov_condition = [&i, &j] () -> bool {
    return (i == 0 || j == 0) ? false : true;
  };

  std::uint32_t prev_i = 0;
  std::uint32_t prev_j = 0;
  while ((type_ == AlignmentType::kSW && sw_condition()) ||
         (type_ == AlignmentType::kNW && nw_condition()) ||
         (type_ == AlignmentType::kOV && ov_condition())) {
    auto H_ij = pimpl_->H[i * matrix_width + j];
    bool predecessor_found = false;

    if (i != 0 && j != 0) {
      const auto& it = rank_to_node[i - 1];
      std::int32_t match_cost =
          pimpl_->sequence_profile[it->code * matrix_width + j];

      std::uint32_t pred_i = it->inedges.empty() ?
          0 : pimpl_->node_id_to_rank[it->inedges[0]->tail->id] + 1;

      if (H_ij == pimpl_->H[pred_i * matrix_width + (j - 1)] + match_cost) {
        prev_i = pred_i;
        prev_j = j - 1;
        predecessor_found = true;
      } else {
        for (std::uint32_t p = 1; p < it->inedges.size(); ++p) {
          std::uint32_t pred_i =
              pimpl_->node_id_to_rank[it->inedges[p]->tail->id] + 1;

          if (H_ij == pimpl_->H[pred_i * matrix_width + (j - 1)] + match_cost) {
            prev_i = pred_i;
            prev_j = j - 1;
            predecessor_found = true;
            break;
          }
        }
      }
    }

    if (!predecessor_found && i != 0) {
      const auto& it = rank_to_node[i - 1];

      std::uint32_t pred_i = it->inedges.empty() ? 0 :
          pimpl_->node_id_to_rank[it->inedges[0]->tail->id] + 1;

      if (H_ij == pimpl_->H[pred_i * matrix_width + j] + g_) {
        prev_i = pred_i;
        prev_j = j;
        predecessor_found = true;
      } else {
        for (std::uint32_t p = 1; p < it->inedges.size(); ++p) {
          std::uint32_t pred_i =
              pimpl_->node_id_to_rank[it->inedges[p]->tail->id] + 1;

          if (H_ij == pimpl_->H[pred_i * matrix_width + j] + g_) {
            prev_i = pred_i;
            prev_j = j;
            predecessor_found = true;
            break;
          }
        }
      }
    }

    if (!predecessor_found && H_ij == pimpl_->H[i * matrix_width + j - 1] + g_) {  // NOLINT
      prev_i = i;
      prev_j = j - 1;
      predecessor_found = true;
    }

    alignment.emplace_back(
        i == prev_i ? -1 : rank_to_node[i - 1]->id,
        j == prev_j ? -1 : j - 1);

    i = prev_i;
    j = prev_j;
  }

  std::reverse(alignment.begin(), alignment.end());
  return alignment;
}